

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindApproxQuantile
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pVVar1;
  int iVar2;
  reference pvVar3;
  pointer pEVar4;
  type expr;
  vector<duckdb::Value,_true> *pvVar5;
  undefined8 *puVar6;
  ParameterNotResolvedException *this_00;
  BinderException *pBVar7;
  Value *element_val;
  pointer pVVar8;
  float fVar9;
  vector<float,_true> quantiles;
  Value quantile_val;
  vector<float,_std::allocator<float>_> local_b8;
  string local_98;
  AggregateFunction *local_78;
  Value local_70;
  
  local_78 = function;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])(pEVar4);
  if ((char)iVar2 != '\0') {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar4);
  if ((char)iVar2 == '\0') {
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    local_70.type_._0_8_ = (long)&local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"APPROXIMATE QUANTILE can only take constant quantile parameters"
               ,"");
    BinderException::BinderException(pBVar7,(string *)&local_70);
    __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar3);
  ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
  if (local_70.is_null == true) {
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"APPROXIMATE QUANTILE parameter list cannot be NULL","");
    BinderException::BinderException(pBVar7,&local_98);
    __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  if ((string)local_70.type_.id_ == (string)0x65) {
    pvVar5 = ListValue::GetChildren(&local_70);
    pVVar8 = (pvVar5->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar1 = (pvVar5->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar8 != pVVar1) {
      do {
        fVar9 = CheckApproxQuantile(pVVar8);
        local_98._M_dataplus._M_p._0_4_ = fVar9;
        if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,(float *)&local_98);
        }
        else {
          *local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = fVar9;
          local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        pVVar8 = pVVar8 + 1;
      } while (pVVar8 != pVVar1);
    }
  }
  else if ((string)local_70.type_.id_ == (string)0x6c) {
    pvVar5 = ArrayValue::GetChildren(&local_70);
    pVVar8 = (pvVar5->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar1 = (pvVar5->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar8 != pVVar1) {
      do {
        fVar9 = CheckApproxQuantile(pVVar8);
        local_98._M_dataplus._M_p._0_4_ = fVar9;
        if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,(float *)&local_98);
        }
        else {
          *local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = fVar9;
          local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        pVVar8 = pVVar8 + 1;
      } while (pVVar8 != pVVar1);
    }
  }
  else {
    fVar9 = CheckApproxQuantile(&local_70);
    local_98._M_dataplus._M_p._0_4_ = fVar9;
    if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_b8,
                 (iterator)
                 local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_98);
    }
    else {
      *local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = fVar9;
      local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  Function::EraseArgument
            ((SimpleFunction *)local_78,arguments,
             ((long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  puVar6 = (undefined8 *)operator_new(0x20);
  ::std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_98,&local_b8);
  *puVar6 = &PTR__ApproximateQuantileBindData_019d9b08;
  puVar6[1] = local_98._M_dataplus._M_p;
  puVar6[2] = local_98._M_string_length;
  puVar6[3] = local_98.field_2._M_allocated_capacity;
  *(undefined8 **)this = puVar6;
  if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindApproxQuantile(ClientContext &context, AggregateFunction &function,
                                            vector<unique_ptr<Expression>> &arguments) {
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw BinderException("APPROXIMATE QUANTILE can only take constant quantile parameters");
	}
	Value quantile_val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
	if (quantile_val.IsNull()) {
		throw BinderException("APPROXIMATE QUANTILE parameter list cannot be NULL");
	}

	vector<float> quantiles;
	switch (quantile_val.type().id()) {
	case LogicalTypeId::LIST:
		for (const auto &element_val : ListValue::GetChildren(quantile_val)) {
			quantiles.push_back(CheckApproxQuantile(element_val));
		}
		break;
	case LogicalTypeId::ARRAY:
		for (const auto &element_val : ArrayValue::GetChildren(quantile_val)) {
			quantiles.push_back(CheckApproxQuantile(element_val));
		}
		break;
	default:
		quantiles.push_back(CheckApproxQuantile(quantile_val));
		break;
	}

	// remove the quantile argument so we can use the unary aggregate
	Function::EraseArgument(function, arguments, arguments.size() - 1);
	return make_uniq<ApproximateQuantileBindData>(quantiles);
}